

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::buffer::move(buffer *this,buffer *from)

{
  bool bVar1;
  buffer *from_local;
  buffer *this_local;
  
  if (this == from) {
    this_local._7_1_ = true;
  }
  else if (this->_size < from->_used) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = trim(this,this->_used);
    if (bVar1) {
      memcpy(this + 1,from + 1,from->_used);
      this->_used = from->_used;
      from->_used = 0;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool buffer::move(buffer &from)
{
	if (this == &from) {
		return true;
	}
	if (_size < from._used) {
		return false;
	}
	if (!trim(_used)) {
		return false;
	}
	memcpy(static_cast<void *>(this + 1), static_cast<void *>((&from) + 1), from._used);
	_used = from._used;
	from._used = 0;
	return true;
}